

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

bool __thiscall
ddd::DictionaryMLT<false,_false>::insert_key
          (DictionaryMLT<false,_false> *this,char *key,uint32_t value)

{
  ulong uVar1;
  bool bVar2;
  uint32_t uVar3;
  Query local_30;
  
  local_30.pos_ = 0;
  local_30.value_ = 0x7fffffff;
  local_30.node_pos_ = 0;
  local_30.is_finished_ = false;
  local_30.key_ = key;
  bVar2 = DaTrie<false,_false,_true>::search_prefix
                    ((this->prefix_subtrie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl,
                     &local_30);
  if (!bVar2) {
    uVar3 = value;
    if (local_30.key_[local_30._8_8_ & 0xffffffff] != '\0') {
      uVar3 = new_suffix_id_(this);
    }
    local_30.value_ = uVar3;
    DaTrie<false,_false,_true>::insert_prefix_leaf
              ((this->prefix_subtrie_)._M_t.
               super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
               .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl,
               &local_30);
    bVar2 = true;
    if (local_30.is_finished_ != false) goto LAB_00120062;
  }
  uVar1 = (ulong)local_30._8_8_ >> 0x20;
  local_30.node_pos_ = 0;
  local_30.value_ = value;
  bVar2 = DaTrie<false,_false,_false>::insert_key
                    ((DaTrie<false,_false,_false> *)
                     (this->suffix_subtries_).
                     super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar1]._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                     ._M_t,&local_30);
  if (!bVar2) {
    return bVar2;
  }
LAB_00120062:
  this->num_keys_ = this->num_keys_ + 1;
  return bVar2;
}

Assistant:

bool insert_key(const char* key, uint32_t value) {
    assert((value >> 31) == 0);

    Query query(key);

    if (!prefix_subtrie_->search_prefix(query)) {
      if (*query.key() != '\0') {
        query.set_value(new_suffix_id_());
      } else {
        query.set_value(value);
      }

      prefix_subtrie_->insert_prefix_leaf(query);

      if (query.is_finished()) {
        ++num_keys_;
        return true;
      }
    }

    auto suffix_id = query.value();
    query.set_node_pos(ROOT_POS);
    query.set_value(value);

    if (!suffix_subtries_[suffix_id]->insert_key(query)) {
      return false;
    }

    ++num_keys_;
    return true;
  }